

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base32.hpp
# Opt level: O2

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 pstore::base32::convert<unsigned_int,std::back_insert_iterator<std::__cxx11::string>>
           (uint val,
           back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           out)

{
  bool bVar1;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  do {
    local_30.container = out.container;
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&local_30,"abcdefghijklmnopqrstuvwxyz234567" + (val & 0x1f));
    bVar1 = 0x1f < val;
    val = val >> 5;
  } while (bVar1);
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out.container;
}

Assistant:

OutputIterator convert (IntType val, OutputIterator out) {
            PSTORE_STATIC_ASSERT (std::is_unsigned<IntType>::value);
            constexpr auto mask = (1U << 5) - 1U;
            PSTORE_ASSERT (mask == alphabet.size () - 1U);
            do {
                *(out++) = alphabet[val & mask];
            } while (val >>= 5);
            return out;
        }